

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_el.h
# Opt level: O0

ostream * lf::base::operator<<(ostream *stream,RefEl *ref_el)

{
  ostream *poVar1;
  string local_38;
  RefEl *local_18;
  RefEl *ref_el_local;
  ostream *stream_local;
  
  local_18 = ref_el;
  ref_el_local = (RefEl *)stream;
  RefEl::ToString_abi_cxx11_(&local_38,ref_el);
  poVar1 = std::operator<<(stream,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return poVar1;
}

Assistant:

inline std::ostream& operator<<(std::ostream& stream, const RefEl& ref_el) {
  return stream << ref_el.ToString();
}